

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,void *data)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  MessageBuilder local_1d8;
  int *local_58;
  GLint *result_value;
  uint local_48;
  uint texel_offset;
  uint x;
  uint line_offset;
  uint y;
  GLint expected_value;
  GLint last_value;
  GLint first_value;
  GLint n_components_per_point;
  uint line_size;
  uchar *result_image;
  void *data_local;
  GeometryShaderMaxOutputComponentsSinglePointTest *this_local;
  
  first_value = 0x20;
  y = this->m_n_available_vectors * 4;
  expected_value = 1;
  line_offset = (int)((y + 1) * y) / 2;
  x = 0;
  last_value = y;
  _n_components_per_point = data;
  result_image = (uchar *)data;
  data_local = this;
  do {
    if (1 < x) {
      return true;
    }
    texel_offset = x << 5;
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      result_value._4_4_ = texel_offset + local_48 * 0x10;
      iVar1 = memcmp((void *)((long)_n_components_per_point + (ulong)result_value._4_4_),
                     &line_offset,4);
      if (iVar1 != 0) {
        local_58 = (int *)((long)_n_components_per_point + (ulong)result_value._4_4_);
        this_00 = tcu::TestContext::getLog
                            ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.
                             super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (&local_1d8,(char (*) [25])"Wrong result! Expected: ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&line_offset);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])" Extracted: ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_58);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [6])"  X: ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_48);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [5])0x2ad8421);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&x);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d8);
        return false;
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult(const void* data)
{
	const unsigned char* result_image			= (const unsigned char*)data;
	const unsigned int   line_size				= m_texture_width * m_texture_pixel_size;
	const glw::GLint	 n_components_per_point = m_n_available_vectors * 4; /* 4 components per vector */

	const glw::GLint first_value	= 1;
	const glw::GLint last_value		= n_components_per_point;
	const glw::GLint expected_value = ((first_value + last_value) * n_components_per_point) / 2;

	/* Verify all pixels that belong to point, area m_point_size x m_point_size */
	for (unsigned int y = 0; y < m_point_size; ++y)
	{
		const unsigned int line_offset = y * line_size;

		for (unsigned int x = 0; x < m_point_size; ++x)
		{
			const unsigned int texel_offset = line_offset + x * m_texture_pixel_size;

			if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
			{
				const glw::GLint* result_value = (const glw::GLint*)(result_image + texel_offset);

				m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! Expected: " << expected_value
								   << " Extracted: " << *result_value << "  X: " << x << " Y: " << y
								   << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}